

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_permitsyms(char *args)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar3 = args;
  if (*args == '\"') {
    pcVar3 = args + 1;
    sVar2 = strlen(pcVar3);
    args[sVar2] = '\0';
  }
  iVar1 = atoi(pcVar3);
  PHYSFS_permitSymbolicLinks(iVar1);
  pcVar3 = "permitted";
  if (iVar1 == 0) {
    pcVar3 = "forbidden";
  }
  printf("Symlinks are now %s.\n",pcVar3);
  return 1;
}

Assistant:

static int cmd_permitsyms(char *args)
{
    int num;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    num = atoi(args);
    PHYSFS_permitSymbolicLinks(num);
    printf("Symlinks are now %s.\n", num ? "permitted" : "forbidden");
    return 1;
}